

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_table_driven_lite.cc
# Opt level: O3

void google::protobuf::internal::anon_unknown_15::UnknownFieldHandlerLite::Varint
               (MessageLite *msg,ParseTable *table,int tag,int value)

{
  ulong uVar1;
  bool bVar2;
  byte *pbVar3;
  LogMessage *other;
  string *ptr;
  string *psVar4;
  byte *pbVar5;
  uint uVar6;
  uint uVar7;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *target;
  undefined1 local_90 [8];
  StringOutputStream unknown_fields_string;
  CodedOutputStream unknown_fields_stream;
  
  if (table->unknown_field_set == true) {
    LogMessage::LogMessage
              ((LogMessage *)&unknown_fields_string.target_,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/LLNL[P]wcs/build_O3/src/src/google/protobuf/generated_message_table_driven_lite.cc"
               ,0x45);
    other = LogMessage::operator<<
                      ((LogMessage *)&unknown_fields_string.target_,
                       "CHECK failed: !table.unknown_field_set: ");
    LogFinisher::operator=((LogFinisher *)local_90,other);
    LogMessage::~LogMessage((LogMessage *)&unknown_fields_string.target_);
  }
  uVar1 = *(ulong *)((long)&msg->_vptr_MessageLite + table->arena_offset);
  if ((uVar1 & 1) == 0) {
    target = InternalMetadata::mutable_unknown_fields_slow<std::__cxx11::string>
                       ((InternalMetadata *)((long)&msg->_vptr_MessageLite + table->arena_offset));
  }
  else {
    target = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             ((uVar1 & 0xfffffffffffffffe) + 8);
  }
  io::StringOutputStream::StringOutputStream((StringOutputStream *)local_90,target);
  io::CodedOutputStream::CodedOutputStream
            ((CodedOutputStream *)&unknown_fields_string.target_,(ZeroCopyOutputStream *)local_90,
             false);
  if (unknown_fields_string.target_ <= (ulong)unknown_fields_stream.impl_._56_8_) {
    unknown_fields_stream.impl_._56_8_ =
         io::EpsCopyOutputStream::EnsureSpaceFallback
                   ((EpsCopyOutputStream *)&unknown_fields_string.target_,
                    (uint8 *)unknown_fields_stream.impl_._56_8_);
  }
  if ((uint)tag < 0x80) {
    *(byte *)unknown_fields_stream.impl_._56_8_ = (byte)tag;
    ptr = (string *)(unknown_fields_stream.impl_._56_8_ + 1);
  }
  else {
    *(byte *)unknown_fields_stream.impl_._56_8_ = (byte)tag | 0x80;
    if ((uint)tag < 0x4000) {
      *(byte *)(unknown_fields_stream.impl_._56_8_ + 1) = (byte)((uint)tag >> 7);
      ptr = (string *)(unknown_fields_stream.impl_._56_8_ + 2);
    }
    else {
      ptr = (string *)(unknown_fields_stream.impl_._56_8_ + 2);
      uVar6 = (uint)tag >> 7;
      do {
        psVar4 = ptr;
        psVar4[-1].field_2._M_local_buf[0xf] = (byte)uVar6 | 0x80;
        uVar7 = uVar6 >> 7;
        ptr = (string *)((long)&(psVar4->_M_dataplus)._M_p + 1);
        bVar2 = 0x3fff < uVar6;
        uVar6 = uVar7;
      } while (bVar2);
      *(byte *)&(psVar4->_M_dataplus)._M_p = (byte)uVar7;
    }
  }
  if (unknown_fields_string.target_ <= ptr) {
    ptr = (string *)
          io::EpsCopyOutputStream::EnsureSpaceFallback
                    ((EpsCopyOutputStream *)&unknown_fields_string.target_,(uint8 *)ptr);
  }
  if ((uint)value < 0x80) {
    *(byte *)&(ptr->_M_dataplus)._M_p = (byte)value;
  }
  else {
    *(byte *)&(ptr->_M_dataplus)._M_p = (byte)value | 0x80;
    if ((uint)value < 0x4000) {
      *(byte *)((long)&(ptr->_M_dataplus)._M_p + 1) = (byte)((uint)value >> 7);
    }
    else {
      pbVar3 = (byte *)((long)&(ptr->_M_dataplus)._M_p + 2);
      uVar6 = (uint)value >> 7;
      do {
        pbVar5 = pbVar3;
        pbVar5[-1] = (byte)uVar6 | 0x80;
        uVar7 = uVar6 >> 7;
        bVar2 = 0x3fff < uVar6;
        pbVar3 = pbVar5 + 1;
        uVar6 = uVar7;
      } while (bVar2);
      *pbVar5 = (byte)uVar7;
    }
  }
  io::CodedOutputStream::~CodedOutputStream((CodedOutputStream *)&unknown_fields_string.target_);
  return;
}

Assistant:

static void Varint(MessageLite* msg, const ParseTable& table, int tag,
                     int value) {
    GOOGLE_DCHECK(!table.unknown_field_set);

    io::StringOutputStream unknown_fields_string(
        MutableUnknownFields(msg, table.arena_offset));
    io::CodedOutputStream unknown_fields_stream(&unknown_fields_string, false);
    unknown_fields_stream.WriteVarint32(tag);
    unknown_fields_stream.WriteVarint32(value);
  }